

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager.cc
# Opt level: O2

Operation * __thiscall
MemoryManager::build_operation(MemoryManager *this,OpCode code,long left,long right)

{
  undefined **ppuVar1;
  Operation *local_20;
  
  switch(code) {
  case Op_Sum:
    local_20 = (Operation *)operator_new(0x18);
    local_20->lf = left;
    local_20->rg = right;
    ppuVar1 = &PTR__Operation_0010bc30;
    break;
  case Op_Mul:
    local_20 = (Operation *)operator_new(0x18);
    local_20->lf = left;
    local_20->rg = right;
    ppuVar1 = &PTR__Operation_0010bca0;
    break;
  case Op_Sub:
    local_20 = (Operation *)operator_new(0x18);
    local_20->lf = left;
    local_20->rg = right;
    ppuVar1 = &PTR__Operation_0010bd00;
    break;
  case Op_Div:
    local_20 = (Operation *)operator_new(0x18);
    local_20->lf = left;
    local_20->rg = right;
    ppuVar1 = &PTR__Operation_0010bd60;
    break;
  default:
    __assert_fail("0 == \"Error: unexpected operation code.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/rg3[P]cifras/memory_manager.cc"
                  ,0x36,"Operation *MemoryManager::build_operation(OpCode, long, long)");
  }
  local_20->_vptr_Operation = (_func_int **)ppuVar1;
  std::__cxx11::list<const_Operation_*,_std::allocator<const_Operation_*>_>::push_back
            (&this->operations,&local_20);
  return local_20;
}

Assistant:

Operation *MemoryManager::build_operation(OpCode code, long left, long right)
{
	Operation *op = 0;
	switch (code) {
	case Op_Sum:
		op = new Sum(left, right);
		break;
	case Op_Mul:
		op = new Mul(left, right);
		break;
	case Op_Sub:
		op = new Sub(left, right);
		break;
	case Op_Div:
		op = new Div(left, right);
		break;
	default:
		assert(0 == "Error: unexpected operation code.");
		break;
	}
	operations.push_back(op);
	return op;
}